

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O1

void amrex::VisMF::CloseStream(string *fileName,bool forceClose)

{
  pointer pcVar1;
  mapped_type *pmVar2;
  
  if ((byte)(usePersistentIFStreams ^ 1 | forceClose) == 1) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::VisMF::PersistentIFStream,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::VisMF::PersistentIFStream>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::VisMF::PersistentIFStream,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::VisMF::PersistentIFStream>_>_>
                           *)persistentIFStreams_abi_cxx11_,fileName);
    if (pmVar2->isOpen == true) {
      std::ifstream::close();
      if (pmVar2->pstr != (ifstream *)0x0) {
        (**(code **)(*(long *)pmVar2->pstr + 8))();
      }
      pmVar2->pstr = (ifstream *)0x0;
      pmVar2->isOpen = false;
    }
    pcVar1 = (pmVar2->ioBuffer).super_vector<char,_std::allocator<char>_>.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if ((pmVar2->ioBuffer).super_vector<char,_std::allocator<char>_>.
        super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish !=
        pcVar1) {
      (pmVar2->ioBuffer).super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
           pcVar1;
    }
  }
  return;
}

Assistant:

void VisMF::CloseStream(const std::string &fileName, bool forceClose)
{
  if(usePersistentIFStreams && ! forceClose) {
    return;
  }

  VisMF::PersistentIFStream &pifs = VisMF::persistentIFStreams[fileName];
  if(pifs.isOpen) {
    pifs.pstr->close();
    delete pifs.pstr;
    pifs.pstr = 0;
    pifs.isOpen = false;
  }
  pifs.ioBuffer.clear();
}